

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar2;
  BVH *bvh;
  size_t sVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined8 uVar13;
  ulong uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  byte bVar30;
  int iVar31;
  AABBNodeMB4D *node1;
  ulong uVar32;
  byte bVar33;
  byte bVar34;
  uint uVar35;
  NodeRef root;
  long lVar36;
  byte bVar37;
  NodeRef *pNVar38;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar39;
  uint uVar40;
  undefined4 uVar41;
  bool bVar42;
  ulong uVar43;
  byte bVar44;
  ulong uVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  vint4 ai_2;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  vint4 ai_1;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 in_ZMM2 [64];
  vint4 ai_3;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  vint4 bi;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  vint4 bi_1;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  vint4 bi_3;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  vint4 bi_2;
  undefined1 auVar90 [16];
  vint4 ai;
  undefined1 auVar91 [16];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  Precalculations pre;
  undefined1 local_1918 [16];
  ulong local_1900;
  undefined1 local_18f8 [16];
  RTCFilterFunctionNArguments args;
  TravRayK<4,_true> tray;
  undefined1 local_17d8 [16];
  undefined1 local_17c8 [16];
  undefined1 local_17b8 [16];
  undefined1 local_17a8 [16];
  undefined1 local_1798 [16];
  undefined1 local_1788 [8];
  float fStack_1780;
  float fStack_177c;
  undefined1 local_1778 [8];
  float fStack_1770;
  float fStack_176c;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  undefined1 local_1728 [16];
  undefined1 local_1718 [16];
  undefined1 local_1708 [16];
  uint local_16f8;
  uint uStack_16f4;
  uint uStack_16f0;
  uint uStack_16ec;
  uint uStack_16e8;
  uint uStack_16e4;
  uint uStack_16e0;
  uint uStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar46 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar51 = ZEXT816(0) << 0x40;
    uVar13 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar51,5);
    uVar45 = vpcmpeqd_avx512vl(auVar46,(undefined1  [16])valid_i->field_0);
    uVar45 = ((byte)uVar13 & 0xf) & uVar45;
    bVar44 = (byte)uVar45;
    if (bVar44 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar94 = ZEXT1664(auVar46);
      auVar47 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar46);
      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar95 = ZEXT1664(auVar48);
      uVar32 = vcmpps_avx512vl(auVar47,auVar48,1);
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar96 = ZEXT1664(auVar47);
      auVar49 = vdivps_avx512vl(auVar47,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar50 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar46);
      uVar43 = vcmpps_avx512vl(auVar50,auVar48,1);
      auVar50 = vdivps_avx512vl(auVar47,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar46 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar46);
      uVar14 = vcmpps_avx512vl(auVar46,auVar48,1);
      auVar46 = vdivps_avx512vl(auVar47,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      bVar42 = (bool)((byte)uVar32 & 1);
      tray.rdir.field_0._0_4_ = (uint)bVar42 * 0x5d5e0b6b | (uint)!bVar42 * auVar49._0_4_;
      bVar42 = (bool)((byte)(uVar32 >> 1) & 1);
      tray.rdir.field_0._4_4_ = (uint)bVar42 * 0x5d5e0b6b | (uint)!bVar42 * auVar49._4_4_;
      bVar42 = (bool)((byte)(uVar32 >> 2) & 1);
      tray.rdir.field_0._8_4_ = (uint)bVar42 * 0x5d5e0b6b | (uint)!bVar42 * auVar49._8_4_;
      bVar42 = (bool)((byte)(uVar32 >> 3) & 1);
      tray.rdir.field_0._12_4_ = (uint)bVar42 * 0x5d5e0b6b | (uint)!bVar42 * auVar49._12_4_;
      bVar42 = (bool)((byte)uVar43 & 1);
      tray.rdir.field_0._16_4_ = (uint)bVar42 * 0x5d5e0b6b | (uint)!bVar42 * auVar50._0_4_;
      bVar42 = (bool)((byte)(uVar43 >> 1) & 1);
      tray.rdir.field_0._20_4_ = (uint)bVar42 * 0x5d5e0b6b | (uint)!bVar42 * auVar50._4_4_;
      bVar42 = (bool)((byte)(uVar43 >> 2) & 1);
      tray.rdir.field_0._24_4_ = (uint)bVar42 * 0x5d5e0b6b | (uint)!bVar42 * auVar50._8_4_;
      bVar42 = (bool)((byte)(uVar43 >> 3) & 1);
      tray.rdir.field_0._28_4_ = (uint)bVar42 * 0x5d5e0b6b | (uint)!bVar42 * auVar50._12_4_;
      bVar42 = (bool)((byte)uVar14 & 1);
      tray.rdir.field_0._32_4_ = (uint)bVar42 * 0x5d5e0b6b | (uint)!bVar42 * auVar46._0_4_;
      bVar42 = (bool)((byte)(uVar14 >> 1) & 1);
      tray.rdir.field_0._36_4_ = (uint)bVar42 * 0x5d5e0b6b | (uint)!bVar42 * auVar46._4_4_;
      bVar42 = (bool)((byte)(uVar14 >> 2) & 1);
      tray.rdir.field_0._40_4_ = (uint)bVar42 * 0x5d5e0b6b | (uint)!bVar42 * auVar46._8_4_;
      bVar42 = (bool)((byte)(uVar14 >> 3) & 1);
      tray.rdir.field_0._44_4_ = (uint)bVar42 * 0x5d5e0b6b | (uint)!bVar42 * auVar46._12_4_;
      uVar32 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar51,1);
      auVar46 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar32 & 1) * auVar46._0_4_;
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar46._4_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar46._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar46._12_4_;
      uVar32 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar51,5);
      auVar46 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar42 = (bool)((byte)uVar32 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar42 * auVar46._0_4_ | (uint)!bVar42 * 0x30;
      bVar42 = (bool)((byte)(uVar32 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar42 * auVar46._4_4_ | (uint)!bVar42 * 0x30;
      bVar42 = (bool)((byte)(uVar32 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar42 * auVar46._8_4_ | (uint)!bVar42 * 0x30;
      bVar42 = (bool)((byte)(uVar32 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar42 * auVar46._12_4_ | (uint)!bVar42 * 0x30;
      uVar32 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar51,5);
      auVar46 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar42 = (bool)((byte)uVar32 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar42 * auVar46._0_4_ | (uint)!bVar42 * 0x50;
      bVar42 = (bool)((byte)(uVar32 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar42 * auVar46._4_4_ | (uint)!bVar42 * 0x50;
      bVar42 = (bool)((byte)(uVar32 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar42 * auVar46._8_4_ | (uint)!bVar42 * 0x50;
      bVar42 = (bool)((byte)(uVar32 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar42 * auVar46._12_4_ | (uint)!bVar42 * 0x50;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar98 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar46 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar51);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar44 & 1) * auVar46._0_4_ |
           (uint)!(bool)(bVar44 & 1) * stack_near[0].field_0._0_4_;
      bVar42 = (bool)((byte)(uVar45 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar42 * auVar46._4_4_ | (uint)!bVar42 * stack_near[0].field_0._4_4_;
      bVar42 = (bool)((byte)(uVar45 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar42 * auVar46._8_4_ | (uint)!bVar42 * stack_near[0].field_0._8_4_;
      bVar42 = SUB81(uVar45 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar42 * auVar46._12_4_ | (uint)!bVar42 * stack_near[0].field_0._12_4_;
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar97 = ZEXT1664(auVar46);
      auVar51 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar51);
      tray.tfar.field_0.i[0] =
           (uint)(bVar44 & 1) * auVar51._0_4_ | (uint)!(bool)(bVar44 & 1) * auVar46._0_4_;
      bVar42 = (bool)((byte)(uVar45 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar42 * auVar51._4_4_ | (uint)!bVar42 * auVar46._4_4_;
      bVar42 = (bool)((byte)(uVar45 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar42 * auVar51._8_4_ | (uint)!bVar42 * auVar46._8_4_;
      bVar42 = SUB81(uVar45 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar42 * auVar51._12_4_ | (uint)!bVar42 * auVar46._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar40 = 3;
      }
      else {
        uVar40 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      bVar37 = (byte)((ushort)((short)uVar45 << 0xc) >> 0xc) ^ 0xf;
      pNVar38 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar39 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar99 = ZEXT1664(auVar46);
      auVar92 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
LAB_0073842c:
      paVar39 = paVar39 + -1;
      root.ptr = pNVar38[-1].ptr;
      pNVar38 = pNVar38 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_00738e37;
      aVar2 = *paVar39;
      uVar45 = vcmpps_avx512vl((undefined1  [16])aVar2,(undefined1  [16])tray.tfar.field_0,1);
      if ((char)uVar45 == '\0') {
LAB_00738e6d:
        iVar31 = 2;
      }
      else {
        uVar41 = (undefined4)uVar45;
        iVar31 = 0;
        if ((uint)POPCOUNT(uVar41) <= uVar40) {
          do {
            sVar3 = 0;
            for (uVar32 = uVar45; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
              sVar3 = sVar3 + 1;
            }
            bVar42 = occluded1(This,bvh,root,sVar3,&pre,ray,&tray,context);
            bVar30 = (byte)(1 << ((uint)sVar3 & 0x1f));
            if (!bVar42) {
              bVar30 = 0;
            }
            bVar37 = bVar37 | bVar30;
            uVar45 = uVar45 - 1 & uVar45;
          } while (uVar45 != 0);
          if (bVar37 == 0xf) {
            iVar31 = 3;
          }
          else {
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)(bVar37 & 1) * auVar46._0_4_ |
                 (uint)!(bool)(bVar37 & 1) * tray.tfar.field_0.i[0];
            bVar42 = (bool)(bVar37 >> 1 & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar42 * auVar46._4_4_ | (uint)!bVar42 * tray.tfar.field_0.i[1];
            bVar42 = (bool)(bVar37 >> 2 & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar42 * auVar46._8_4_ | (uint)!bVar42 * tray.tfar.field_0.i[2];
            bVar42 = (bool)(bVar37 >> 3 & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar42 * auVar46._12_4_ | (uint)!bVar42 * tray.tfar.field_0.i[3];
            iVar31 = 2;
          }
          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar94 = ZEXT1664(auVar46);
          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
          auVar95 = ZEXT1664(auVar46);
          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar96 = ZEXT1664(auVar46);
          auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
          auVar97 = ZEXT1664(auVar46);
          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar98 = ZEXT1664(auVar46);
          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
          auVar99 = ZEXT1664(auVar46);
          auVar92 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
        }
        auVar93 = ZEXT1664((undefined1  [16])aVar2);
        if (uVar40 < (uint)POPCOUNT(uVar41)) {
          do {
            uVar35 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00738e37;
              uVar13 = vcmpps_avx512vl(auVar93._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar13 == '\0') goto LAB_00738e6d;
              bVar30 = bVar37 & 0xf;
              local_1900 = (ulong)(uVar35 & 0xf) - 8;
              if (local_1900 == 0) goto LAB_00738e2e;
              bVar30 = bVar30 ^ 0xf;
              lVar36 = (root.ptr & 0xfffffffffffffff0) + 0x130;
              uVar45 = 0;
              goto LAB_007386e3;
            }
            uVar13 = vcmpps_avx512vl(auVar93._0_16_,(undefined1  [16])tray.tfar.field_0,9);
            uVar32 = root.ptr & 0xfffffffffffffff0;
            auVar93 = ZEXT1664(auVar98._0_16_);
            uVar45 = 0;
            root.ptr = 8;
            do {
              sVar3 = *(size_t *)(uVar32 + uVar45 * 8);
              if (sVar3 != 8) {
                uVar41 = *(undefined4 *)(uVar32 + 0x80 + uVar45 * 4);
                auVar74._4_4_ = uVar41;
                auVar74._0_4_ = uVar41;
                auVar74._8_4_ = uVar41;
                auVar74._12_4_ = uVar41;
                auVar46 = *(undefined1 (*) [16])(ray + 0x70);
                uVar41 = *(undefined4 *)(uVar32 + 0x20 + uVar45 * 4);
                auVar19._4_4_ = uVar41;
                auVar19._0_4_ = uVar41;
                auVar19._8_4_ = uVar41;
                auVar19._12_4_ = uVar41;
                auVar51 = vfmadd213ps_avx512vl(auVar74,auVar46,auVar19);
                uVar41 = *(undefined4 *)(uVar32 + 0xa0 + uVar45 * 4);
                auVar76._4_4_ = uVar41;
                auVar76._0_4_ = uVar41;
                auVar76._8_4_ = uVar41;
                auVar76._12_4_ = uVar41;
                uVar41 = *(undefined4 *)(uVar32 + 0x40 + uVar45 * 4);
                auVar20._4_4_ = uVar41;
                auVar20._0_4_ = uVar41;
                auVar20._8_4_ = uVar41;
                auVar20._12_4_ = uVar41;
                auVar47 = vfmadd213ps_avx512vl(auVar76,auVar46,auVar20);
                uVar41 = *(undefined4 *)(uVar32 + 0xc0 + uVar45 * 4);
                auVar79._4_4_ = uVar41;
                auVar79._0_4_ = uVar41;
                auVar79._8_4_ = uVar41;
                auVar79._12_4_ = uVar41;
                uVar41 = *(undefined4 *)(uVar32 + 0x60 + uVar45 * 4);
                auVar21._4_4_ = uVar41;
                auVar21._0_4_ = uVar41;
                auVar21._8_4_ = uVar41;
                auVar21._12_4_ = uVar41;
                auVar48 = vfmadd213ps_avx512vl(auVar79,auVar46,auVar21);
                uVar41 = *(undefined4 *)(uVar32 + 0x90 + uVar45 * 4);
                auVar82._4_4_ = uVar41;
                auVar82._0_4_ = uVar41;
                auVar82._8_4_ = uVar41;
                auVar82._12_4_ = uVar41;
                uVar41 = *(undefined4 *)(uVar32 + 0x30 + uVar45 * 4);
                auVar22._4_4_ = uVar41;
                auVar22._0_4_ = uVar41;
                auVar22._8_4_ = uVar41;
                auVar22._12_4_ = uVar41;
                auVar49 = vfmadd213ps_avx512vl(auVar82,auVar46,auVar22);
                uVar41 = *(undefined4 *)(uVar32 + 0xb0 + uVar45 * 4);
                auVar84._4_4_ = uVar41;
                auVar84._0_4_ = uVar41;
                auVar84._8_4_ = uVar41;
                auVar84._12_4_ = uVar41;
                uVar41 = *(undefined4 *)(uVar32 + 0x50 + uVar45 * 4);
                auVar23._4_4_ = uVar41;
                auVar23._0_4_ = uVar41;
                auVar23._8_4_ = uVar41;
                auVar23._12_4_ = uVar41;
                auVar50 = vfmadd213ps_avx512vl(auVar84,auVar46,auVar23);
                uVar41 = *(undefined4 *)(uVar32 + 0xd0 + uVar45 * 4);
                auVar87._4_4_ = uVar41;
                auVar87._0_4_ = uVar41;
                auVar87._8_4_ = uVar41;
                auVar87._12_4_ = uVar41;
                uVar41 = *(undefined4 *)(uVar32 + 0x70 + uVar45 * 4);
                auVar24._4_4_ = uVar41;
                auVar24._0_4_ = uVar41;
                auVar24._8_4_ = uVar41;
                auVar24._12_4_ = uVar41;
                auVar52 = vfmadd213ps_avx512vl(auVar87,auVar46,auVar24);
                auVar27._8_8_ = tray.org.field_0._8_8_;
                auVar27._0_8_ = tray.org.field_0._0_8_;
                auVar28._8_8_ = tray.org.field_0._24_8_;
                auVar28._0_8_ = tray.org.field_0._16_8_;
                auVar29._8_8_ = tray.org.field_0._40_8_;
                auVar29._0_8_ = tray.org.field_0._32_8_;
                auVar51 = vsubps_avx(auVar51,auVar27);
                auVar91._0_4_ = tray.rdir.field_0._0_4_ * auVar51._0_4_;
                auVar91._4_4_ = tray.rdir.field_0._4_4_ * auVar51._4_4_;
                auVar91._8_4_ = tray.rdir.field_0._8_4_ * auVar51._8_4_;
                auVar91._12_4_ = tray.rdir.field_0._12_4_ * auVar51._12_4_;
                auVar51 = vsubps_avx(auVar47,auVar28);
                auVar77._0_4_ = auVar51._0_4_ * (float)tray.rdir.field_0._16_4_;
                auVar77._4_4_ = auVar51._4_4_ * (float)tray.rdir.field_0._20_4_;
                auVar77._8_4_ = auVar51._8_4_ * (float)tray.rdir.field_0._24_4_;
                auVar77._12_4_ = auVar51._12_4_ * (float)tray.rdir.field_0._28_4_;
                auVar51 = vsubps_avx(auVar48,auVar29);
                auVar80._0_4_ = tray.rdir.field_0._32_4_ * auVar51._0_4_;
                auVar80._4_4_ = tray.rdir.field_0._36_4_ * auVar51._4_4_;
                auVar80._8_4_ = tray.rdir.field_0._40_4_ * auVar51._8_4_;
                auVar80._12_4_ = tray.rdir.field_0._44_4_ * auVar51._12_4_;
                auVar51 = vsubps_avx(auVar49,auVar27);
                auVar83._0_4_ = tray.rdir.field_0._0_4_ * auVar51._0_4_;
                auVar83._4_4_ = tray.rdir.field_0._4_4_ * auVar51._4_4_;
                auVar83._8_4_ = tray.rdir.field_0._8_4_ * auVar51._8_4_;
                auVar83._12_4_ = tray.rdir.field_0._12_4_ * auVar51._12_4_;
                auVar51 = vsubps_avx(auVar50,auVar28);
                auVar85._0_4_ = auVar51._0_4_ * (float)tray.rdir.field_0._16_4_;
                auVar85._4_4_ = auVar51._4_4_ * (float)tray.rdir.field_0._20_4_;
                auVar85._8_4_ = auVar51._8_4_ * (float)tray.rdir.field_0._24_4_;
                auVar85._12_4_ = auVar51._12_4_ * (float)tray.rdir.field_0._28_4_;
                auVar51 = vsubps_avx(auVar52,auVar29);
                auVar88._0_4_ = tray.rdir.field_0._32_4_ * auVar51._0_4_;
                auVar88._4_4_ = tray.rdir.field_0._36_4_ * auVar51._4_4_;
                auVar88._8_4_ = tray.rdir.field_0._40_4_ * auVar51._8_4_;
                auVar88._12_4_ = tray.rdir.field_0._44_4_ * auVar51._12_4_;
                auVar51 = vpminsd_avx(auVar91,auVar83);
                auVar47 = vpminsd_avx(auVar77,auVar85);
                auVar51 = vpmaxsd_avx(auVar51,auVar47);
                auVar47 = vpminsd_avx(auVar80,auVar88);
                auVar51 = vpmaxsd_avx(auVar51,auVar47);
                auVar48 = vmulps_avx512vl(auVar51,auVar99._0_16_);
                auVar51 = vpmaxsd_avx(auVar91,auVar83);
                auVar47 = vpmaxsd_avx(auVar77,auVar85);
                auVar47 = vpminsd_avx(auVar51,auVar47);
                auVar51 = vpmaxsd_avx(auVar80,auVar88);
                auVar51 = vpminsd_avx(auVar47,auVar51);
                auVar78._0_4_ = auVar92._0_4_ * auVar51._0_4_;
                auVar78._4_4_ = auVar92._4_4_ * auVar51._4_4_;
                auVar78._8_4_ = auVar92._8_4_ * auVar51._8_4_;
                auVar78._12_4_ = auVar92._12_4_ * auVar51._12_4_;
                auVar51 = vpmaxsd_avx(auVar48,(undefined1  [16])tray.tnear.field_0);
                auVar47 = vpminsd_avx(auVar78,(undefined1  [16])tray.tfar.field_0);
                uVar15 = vcmpps_avx512vl(auVar51,auVar47,2);
                bVar30 = (byte)uVar15;
                if ((uVar35 & 7) == 6) {
                  uVar41 = *(undefined4 *)(uVar32 + 0xf0 + uVar45 * 4);
                  auVar25._4_4_ = uVar41;
                  auVar25._0_4_ = uVar41;
                  auVar25._8_4_ = uVar41;
                  auVar25._12_4_ = uVar41;
                  uVar15 = vcmpps_avx512vl(auVar46,auVar25,1);
                  uVar41 = *(undefined4 *)(uVar32 + 0xe0 + uVar45 * 4);
                  auVar26._4_4_ = uVar41;
                  auVar26._0_4_ = uVar41;
                  auVar26._8_4_ = uVar41;
                  auVar26._12_4_ = uVar41;
                  uVar16 = vcmpps_avx512vl(auVar46,auVar26,0xd);
                  bVar30 = (byte)uVar15 & (byte)uVar16 & bVar30;
                }
                bVar30 = bVar30 & (byte)uVar13;
                if (bVar30 != 0) {
                  auVar51 = vblendmps_avx512vl(auVar98._0_16_,auVar48);
                  bVar42 = (bool)(bVar30 >> 1 & 1);
                  bVar6 = (bool)(bVar30 >> 2 & 1);
                  bVar7 = (bool)(bVar30 >> 3 & 1);
                  if (root.ptr != 8) {
                    pNVar38->ptr = root.ptr;
                    pNVar38 = pNVar38 + 1;
                    *paVar39 = auVar93._0_16_;
                    paVar39 = paVar39 + 1;
                  }
                  auVar93 = ZEXT1664(CONCAT412((uint)bVar7 * auVar51._12_4_ |
                                               (uint)!bVar7 * auVar46._12_4_,
                                               CONCAT48((uint)bVar6 * auVar51._8_4_ |
                                                        (uint)!bVar6 * auVar46._8_4_,
                                                        CONCAT44((uint)bVar42 * auVar51._4_4_ |
                                                                 (uint)!bVar42 * auVar46._4_4_,
                                                                 (uint)(bVar30 & 1) * auVar51._0_4_
                                                                 | (uint)!(bool)(bVar30 & 1) *
                                                                   auVar46._0_4_))));
                  root.ptr = sVar3;
                }
              }
            } while ((sVar3 != 8) && (bVar42 = uVar45 < 3, uVar45 = uVar45 + 1, bVar42));
            iVar31 = 0;
            if (root.ptr == 8) {
LAB_00738697:
              bVar42 = false;
              iVar31 = 4;
            }
            else {
              uVar13 = vcmpps_avx512vl((undefined1  [16])auVar93._0_16_,
                                       (undefined1  [16])tray.tfar.field_0,9);
              bVar42 = true;
              if ((uint)POPCOUNT((int)uVar13) <= uVar40) {
                pNVar38->ptr = root.ptr;
                pNVar38 = pNVar38 + 1;
                *paVar39 = auVar93._0_16_;
                paVar39 = paVar39 + 1;
                goto LAB_00738697;
              }
            }
          } while (bVar42);
        }
      }
      goto LAB_00738e5f;
    }
  }
  return;
  while( true ) {
    uVar45 = uVar45 + 1;
    lVar36 = lVar36 + 0x140;
    if (local_1900 <= uVar45) break;
LAB_007386e3:
    uVar32 = 0;
    bVar34 = bVar30;
    while (uVar43 = (ulong)*(uint *)(lVar36 + -0x10 + uVar32 * 4), uVar43 != 0xffffffff) {
      auVar46 = *(undefined1 (*) [16])(ray + 0x70);
      uVar41 = *(undefined4 *)(lVar36 + -0xa0 + uVar32 * 4);
      auVar53._4_4_ = uVar41;
      auVar53._0_4_ = uVar41;
      auVar53._8_4_ = uVar41;
      auVar53._12_4_ = uVar41;
      uVar41 = *(undefined4 *)(lVar36 + -0x90 + uVar32 * 4);
      auVar54._4_4_ = uVar41;
      auVar54._0_4_ = uVar41;
      auVar54._8_4_ = uVar41;
      auVar54._12_4_ = uVar41;
      uVar41 = *(undefined4 *)(lVar36 + -0x80 + uVar32 * 4);
      auVar55._4_4_ = uVar41;
      auVar55._0_4_ = uVar41;
      auVar55._8_4_ = uVar41;
      auVar55._12_4_ = uVar41;
      uVar41 = *(undefined4 *)(lVar36 + -0x130 + uVar32 * 4);
      auVar51._4_4_ = uVar41;
      auVar51._0_4_ = uVar41;
      auVar51._8_4_ = uVar41;
      auVar51._12_4_ = uVar41;
      auVar53 = vfmadd213ps_avx512vl(auVar53,auVar46,auVar51);
      uVar41 = *(undefined4 *)(lVar36 + -0x120 + uVar32 * 4);
      auVar47._4_4_ = uVar41;
      auVar47._0_4_ = uVar41;
      auVar47._8_4_ = uVar41;
      auVar47._12_4_ = uVar41;
      auVar54 = vfmadd213ps_avx512vl(auVar54,auVar46,auVar47);
      uVar41 = *(undefined4 *)(lVar36 + -0x110 + uVar32 * 4);
      auVar48._4_4_ = uVar41;
      auVar48._0_4_ = uVar41;
      auVar48._8_4_ = uVar41;
      auVar48._12_4_ = uVar41;
      auVar55 = vfmadd213ps_avx512vl(auVar55,auVar46,auVar48);
      uVar41 = *(undefined4 *)(lVar36 + -0x70 + uVar32 * 4);
      auVar56._4_4_ = uVar41;
      auVar56._0_4_ = uVar41;
      auVar56._8_4_ = uVar41;
      auVar56._12_4_ = uVar41;
      uVar41 = *(undefined4 *)(lVar36 + -0x60 + uVar32 * 4);
      auVar57._4_4_ = uVar41;
      auVar57._0_4_ = uVar41;
      auVar57._8_4_ = uVar41;
      auVar57._12_4_ = uVar41;
      uVar41 = *(undefined4 *)(lVar36 + -0x50 + uVar32 * 4);
      auVar58._4_4_ = uVar41;
      auVar58._0_4_ = uVar41;
      auVar58._8_4_ = uVar41;
      auVar58._12_4_ = uVar41;
      uVar41 = *(undefined4 *)(lVar36 + -0x100 + uVar32 * 4);
      auVar49._4_4_ = uVar41;
      auVar49._0_4_ = uVar41;
      auVar49._8_4_ = uVar41;
      auVar49._12_4_ = uVar41;
      auVar56 = vfmadd213ps_avx512vl(auVar56,auVar46,auVar49);
      uVar41 = *(undefined4 *)(lVar36 + -0xf0 + uVar32 * 4);
      auVar50._4_4_ = uVar41;
      auVar50._0_4_ = uVar41;
      auVar50._8_4_ = uVar41;
      auVar50._12_4_ = uVar41;
      auVar57 = vfmadd213ps_avx512vl(auVar57,auVar46,auVar50);
      uVar41 = *(undefined4 *)(lVar36 + -0xe0 + uVar32 * 4);
      auVar52._4_4_ = uVar41;
      auVar52._0_4_ = uVar41;
      auVar52._8_4_ = uVar41;
      auVar52._12_4_ = uVar41;
      auVar58 = vfmadd213ps_avx512vl(auVar58,auVar46,auVar52);
      uVar41 = *(undefined4 *)(lVar36 + -0x40 + uVar32 * 4);
      auVar59._4_4_ = uVar41;
      auVar59._0_4_ = uVar41;
      auVar59._8_4_ = uVar41;
      auVar59._12_4_ = uVar41;
      uVar41 = *(undefined4 *)(lVar36 + -0x30 + uVar32 * 4);
      auVar62._4_4_ = uVar41;
      auVar62._0_4_ = uVar41;
      auVar62._8_4_ = uVar41;
      auVar62._12_4_ = uVar41;
      uVar41 = *(undefined4 *)(lVar36 + -0x20 + uVar32 * 4);
      auVar63._4_4_ = uVar41;
      auVar63._0_4_ = uVar41;
      auVar63._8_4_ = uVar41;
      auVar63._12_4_ = uVar41;
      uVar41 = *(undefined4 *)(lVar36 + -0xd0 + uVar32 * 4);
      auVar12._4_4_ = uVar41;
      auVar12._0_4_ = uVar41;
      auVar12._8_4_ = uVar41;
      auVar12._12_4_ = uVar41;
      auVar59 = vfmadd213ps_avx512vl(auVar59,auVar46,auVar12);
      uVar41 = *(undefined4 *)(lVar36 + -0xc0 + uVar32 * 4);
      auVar60._4_4_ = uVar41;
      auVar60._0_4_ = uVar41;
      auVar60._8_4_ = uVar41;
      auVar60._12_4_ = uVar41;
      auVar60 = vfmadd213ps_avx512vl(auVar62,auVar46,auVar60);
      uVar41 = *(undefined4 *)(lVar36 + -0xb0 + uVar32 * 4);
      auVar61._4_4_ = uVar41;
      auVar61._0_4_ = uVar41;
      auVar61._8_4_ = uVar41;
      auVar61._12_4_ = uVar41;
      auVar61 = vfmadd213ps_avx512vl(auVar63,auVar46,auVar61);
      auVar46 = *(undefined1 (*) [16])ray;
      auVar51 = *(undefined1 (*) [16])(ray + 0x10);
      auVar47 = *(undefined1 (*) [16])(ray + 0x20);
      auVar48 = *(undefined1 (*) [16])(ray + 0x40);
      auVar49 = *(undefined1 (*) [16])(ray + 0x50);
      auVar50 = *(undefined1 (*) [16])(ray + 0x60);
      auVar52 = vsubps_avx(auVar53,auVar46);
      auVar12 = vsubps_avx(auVar54,auVar51);
      auVar53 = vsubps_avx512vl(auVar55,auVar47);
      auVar54 = vsubps_avx512vl(auVar56,auVar46);
      auVar55 = vsubps_avx512vl(auVar57,auVar51);
      auVar56 = vsubps_avx512vl(auVar58,auVar47);
      auVar57 = vsubps_avx512vl(auVar59,auVar46);
      auVar51 = vsubps_avx512vl(auVar60,auVar51);
      auVar47 = vsubps_avx512vl(auVar61,auVar47);
      auVar60 = vsubps_avx512vl(auVar57,auVar52);
      auVar61 = vsubps_avx512vl(auVar51,auVar12);
      auVar58 = vsubps_avx512vl(auVar47,auVar53);
      auVar59 = vsubps_avx512vl(auVar52,auVar54);
      auVar62 = vsubps_avx512vl(auVar12,auVar55);
      auVar63 = vsubps_avx512vl(auVar53,auVar56);
      auVar64 = vsubps_avx512vl(auVar54,auVar57);
      auVar65 = vsubps_avx512vl(auVar55,auVar51);
      auVar66 = vsubps_avx512vl(auVar56,auVar47);
      auVar46 = vaddps_avx512vl(auVar57,auVar52);
      auVar67 = vaddps_avx512vl(auVar51,auVar12);
      auVar68 = vaddps_avx512vl(auVar47,auVar53);
      auVar69 = vmulps_avx512vl(auVar67,auVar58);
      auVar69 = vfmsub231ps_avx512vl(auVar69,auVar61,auVar68);
      auVar68 = vmulps_avx512vl(auVar68,auVar60);
      auVar68 = vfmsub231ps_avx512vl(auVar68,auVar58,auVar46);
      auVar70._0_4_ = auVar46._0_4_ * auVar61._0_4_;
      auVar70._4_4_ = auVar46._4_4_ * auVar61._4_4_;
      auVar70._8_4_ = auVar46._8_4_ * auVar61._8_4_;
      auVar70._12_4_ = auVar46._12_4_ * auVar61._12_4_;
      auVar46 = vfmsub231ps_fma(auVar70,auVar60,auVar67);
      fVar8 = auVar50._0_4_;
      auVar67._0_4_ = auVar46._0_4_ * fVar8;
      fVar9 = auVar50._4_4_;
      auVar67._4_4_ = auVar46._4_4_ * fVar9;
      fVar10 = auVar50._8_4_;
      auVar67._8_4_ = auVar46._8_4_ * fVar10;
      fVar11 = auVar50._12_4_;
      auVar67._12_4_ = auVar46._12_4_ * fVar11;
      auVar46 = vfmadd231ps_avx512vl(auVar67,auVar49,auVar68);
      auVar67 = vfmadd231ps_avx512vl(auVar46,auVar48,auVar69);
      auVar46 = vaddps_avx512vl(auVar52,auVar54);
      auVar68 = vaddps_avx512vl(auVar12,auVar55);
      auVar69 = vaddps_avx512vl(auVar53,auVar56);
      auVar70 = vmulps_avx512vl(auVar68,auVar63);
      auVar70 = vfmsub231ps_avx512vl(auVar70,auVar62,auVar69);
      auVar69 = vmulps_avx512vl(auVar69,auVar59);
      auVar69 = vfmsub231ps_avx512vl(auVar69,auVar63,auVar46);
      auVar46 = vmulps_avx512vl(auVar46,auVar62);
      auVar46 = vfmsub231ps_avx512vl(auVar46,auVar59,auVar68);
      auVar68._0_4_ = auVar46._0_4_ * fVar8;
      auVar68._4_4_ = auVar46._4_4_ * fVar9;
      auVar68._8_4_ = auVar46._8_4_ * fVar10;
      auVar68._12_4_ = auVar46._12_4_ * fVar11;
      auVar46 = vfmadd231ps_avx512vl(auVar68,auVar49,auVar69);
      auVar68 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar69 = vfmadd231ps_avx512vl(auVar46,auVar48,auVar70);
      auVar46 = vaddps_avx512vl(auVar54,auVar57);
      auVar51 = vaddps_avx512vl(auVar55,auVar51);
      auVar47 = vaddps_avx512vl(auVar56,auVar47);
      auVar54 = vmulps_avx512vl(auVar51,auVar66);
      auVar54 = vfmsub231ps_avx512vl(auVar54,auVar65,auVar47);
      auVar47 = vmulps_avx512vl(auVar47,auVar64);
      auVar47 = vfmsub231ps_avx512vl(auVar47,auVar66,auVar46);
      auVar46 = vmulps_avx512vl(auVar46,auVar65);
      auVar46 = vfmsub231ps_avx512vl(auVar46,auVar64,auVar51);
      auVar46 = vmulps_avx512vl(auVar46,auVar50);
      auVar46 = vfmadd231ps_avx512vl(auVar46,auVar49,auVar47);
      auVar51 = vfmadd231ps_avx512vl(auVar46,auVar48,auVar54);
      auVar46 = vaddps_avx512vl(auVar67,auVar69);
      auVar47 = vaddps_avx512vl(auVar51,auVar46);
      auVar55 = auVar94._0_16_;
      auVar50 = vandps_avx512vl(auVar47,auVar55);
      auVar46._8_4_ = 0x34000000;
      auVar46._0_8_ = 0x3400000034000000;
      auVar46._12_4_ = 0x34000000;
      auVar46 = vmulps_avx512vl(auVar50,auVar46);
      auVar50 = vminps_avx512vl(auVar67,auVar69);
      auVar50 = vminps_avx512vl(auVar50,auVar51);
      auVar54 = vxorps_avx512vl(auVar46,auVar68);
      uVar13 = vcmpps_avx512vl(auVar50,auVar54,5);
      auVar50 = vmaxps_avx512vl(auVar67,auVar69);
      auVar51 = vmaxps_avx512vl(auVar50,auVar51);
      uVar15 = vcmpps_avx512vl(auVar51,auVar46,2);
      bVar33 = ((byte)uVar13 | (byte)uVar15) & 0xf & bVar34;
      auVar46 = auVar96._0_16_;
      if (bVar33 != 0) {
        auVar51 = vmulps_avx512vl(auVar62,auVar58);
        auVar50 = vmulps_avx512vl(auVar60,auVar63);
        auVar54 = vmulps_avx512vl(auVar59,auVar61);
        auVar56 = vmulps_avx512vl(auVar65,auVar63);
        auVar57 = vmulps_avx512vl(auVar59,auVar66);
        auVar70 = vmulps_avx512vl(auVar64,auVar62);
        auVar61 = vfmsub213ps_avx512vl(auVar61,auVar63,auVar51);
        auVar58 = vfmsub213ps_avx512vl(auVar58,auVar59,auVar50);
        auVar60 = vfmsub213ps_avx512vl(auVar60,auVar62,auVar54);
        auVar62 = vfmsub213ps_avx512vl(auVar66,auVar62,auVar56);
        auVar63 = vfmsub213ps_avx512vl(auVar64,auVar63,auVar57);
        auVar59 = vfmsub213ps_avx512vl(auVar65,auVar59,auVar70);
        auVar51 = vandps_avx512vl(auVar51,auVar55);
        auVar56 = vandps_avx512vl(auVar56,auVar55);
        uVar14 = vcmpps_avx512vl(auVar51,auVar56,1);
        auVar51 = vandps_avx512vl(auVar50,auVar55);
        auVar50 = vandps_avx512vl(auVar57,auVar55);
        uVar17 = vcmpps_avx512vl(auVar51,auVar50,1);
        auVar51 = vandps_avx512vl(auVar54,auVar55);
        auVar50 = vandps_avx512vl(auVar70,auVar55);
        uVar18 = vcmpps_avx512vl(auVar51,auVar50,1);
        bVar42 = (bool)((byte)uVar14 & 1);
        auVar64._0_4_ = (uint)bVar42 * auVar61._0_4_ | (uint)!bVar42 * auVar62._0_4_;
        bVar42 = (bool)((byte)(uVar14 >> 1) & 1);
        auVar64._4_4_ = (uint)bVar42 * auVar61._4_4_ | (uint)!bVar42 * auVar62._4_4_;
        bVar42 = (bool)((byte)(uVar14 >> 2) & 1);
        auVar64._8_4_ = (uint)bVar42 * auVar61._8_4_ | (uint)!bVar42 * auVar62._8_4_;
        bVar42 = (bool)((byte)(uVar14 >> 3) & 1);
        auVar64._12_4_ = (uint)bVar42 * auVar61._12_4_ | (uint)!bVar42 * auVar62._12_4_;
        bVar42 = (bool)((byte)uVar17 & 1);
        auVar65._0_4_ = (uint)bVar42 * auVar58._0_4_ | (uint)!bVar42 * auVar63._0_4_;
        bVar42 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar65._4_4_ = (uint)bVar42 * auVar58._4_4_ | (uint)!bVar42 * auVar63._4_4_;
        bVar42 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar65._8_4_ = (uint)bVar42 * auVar58._8_4_ | (uint)!bVar42 * auVar63._8_4_;
        bVar42 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar65._12_4_ = (uint)bVar42 * auVar58._12_4_ | (uint)!bVar42 * auVar63._12_4_;
        bVar42 = (bool)((byte)uVar18 & 1);
        auVar66._0_4_ = (float)((uint)bVar42 * auVar60._0_4_ | (uint)!bVar42 * auVar59._0_4_);
        bVar42 = (bool)((byte)(uVar18 >> 1) & 1);
        auVar66._4_4_ = (float)((uint)bVar42 * auVar60._4_4_ | (uint)!bVar42 * auVar59._4_4_);
        bVar42 = (bool)((byte)(uVar18 >> 2) & 1);
        auVar66._8_4_ = (float)((uint)bVar42 * auVar60._8_4_ | (uint)!bVar42 * auVar59._8_4_);
        bVar42 = (bool)((byte)(uVar18 >> 3) & 1);
        auVar66._12_4_ = (float)((uint)bVar42 * auVar60._12_4_ | (uint)!bVar42 * auVar59._12_4_);
        auVar90._0_4_ = fVar8 * auVar66._0_4_;
        auVar90._4_4_ = fVar9 * auVar66._4_4_;
        auVar90._8_4_ = fVar10 * auVar66._8_4_;
        auVar90._12_4_ = fVar11 * auVar66._12_4_;
        auVar51 = vfmadd213ps_fma(auVar49,auVar65,auVar90);
        auVar51 = vfmadd213ps_fma(auVar48,auVar64,auVar51);
        auVar86._0_4_ = auVar51._0_4_ + auVar51._0_4_;
        auVar86._4_4_ = auVar51._4_4_ + auVar51._4_4_;
        auVar86._8_4_ = auVar51._8_4_ + auVar51._8_4_;
        auVar86._12_4_ = auVar51._12_4_ + auVar51._12_4_;
        auVar89._0_4_ = auVar53._0_4_ * auVar66._0_4_;
        auVar89._4_4_ = auVar53._4_4_ * auVar66._4_4_;
        auVar89._8_4_ = auVar53._8_4_ * auVar66._8_4_;
        auVar89._12_4_ = auVar53._12_4_ * auVar66._12_4_;
        auVar51 = vfmadd213ps_fma(auVar12,auVar65,auVar89);
        auVar48 = vfmadd213ps_fma(auVar52,auVar64,auVar51);
        auVar51 = vrcp14ps_avx512vl(auVar86);
        auVar49 = vxorps_avx512vl(auVar86,auVar68);
        auVar50 = vfnmadd213ps_avx512vl(auVar51,auVar86,auVar46);
        auVar51 = vfmadd132ps_fma(auVar50,auVar51,auVar51);
        auVar81._0_4_ = (auVar48._0_4_ + auVar48._0_4_) * auVar51._0_4_;
        auVar81._4_4_ = (auVar48._4_4_ + auVar48._4_4_) * auVar51._4_4_;
        auVar81._8_4_ = (auVar48._8_4_ + auVar48._8_4_) * auVar51._8_4_;
        auVar81._12_4_ = (auVar48._12_4_ + auVar48._12_4_) * auVar51._12_4_;
        uVar13 = vcmpps_avx512vl(auVar81,*(undefined1 (*) [16])(ray + 0x80),2);
        uVar15 = vcmpps_avx512vl(auVar81,*(undefined1 (*) [16])(ray + 0x30),0xd);
        uVar16 = vcmpps_avx512vl(auVar86,auVar49,4);
        bVar33 = bVar33 & (byte)uVar13 & (byte)uVar15 & (byte)uVar16;
        if (bVar33 != 0) {
          local_17d8 = auVar66;
          local_17c8 = auVar65;
          local_17b8 = auVar64;
          local_17a8 = auVar81;
          local_1798 = auVar47;
          _local_1788 = auVar69;
          _local_1778 = auVar67;
        }
      }
      auVar92 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      pGVar4 = (context->scene->geometries).items[uVar43].ptr;
      uVar35 = pGVar4->mask;
      auVar69._4_4_ = uVar35;
      auVar69._0_4_ = uVar35;
      auVar69._8_4_ = uVar35;
      auVar69._12_4_ = uVar35;
      uVar13 = vptestmd_avx512vl(auVar69,*(undefined1 (*) [16])(ray + 0x90));
      bVar33 = (byte)uVar13 & 0xf & bVar33;
      uVar43 = (ulong)bVar33;
      if (bVar33 != 0) {
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar51 = vandps_avx512vl(local_1798,auVar55);
          uVar43 = vcmpps_avx512vl(auVar51,auVar95._0_16_,5);
          auVar51 = vrcp14ps_avx512vl(local_1798);
          auVar47 = vfnmadd213ps_avx512vl(auVar51,local_1798,auVar46);
          auVar51 = vfmadd132ps_avx512vl(auVar47,auVar51,auVar51);
          fVar8 = (float)((uint)((byte)uVar43 & 1) * auVar51._0_4_);
          fVar9 = (float)((uint)((byte)(uVar43 >> 1) & 1) * auVar51._4_4_);
          fVar10 = (float)((uint)((byte)(uVar43 >> 2) & 1) * auVar51._8_4_);
          fVar11 = (float)((uint)((byte)(uVar43 >> 3) & 1) * auVar51._12_4_);
          auVar73._0_4_ = fVar8 * (float)local_1778._0_4_;
          auVar73._4_4_ = fVar9 * (float)local_1778._4_4_;
          auVar73._8_4_ = fVar10 * fStack_1770;
          auVar73._12_4_ = fVar11 * fStack_176c;
          local_1738 = vminps_avx512vl(auVar73,auVar46);
          auVar75._0_4_ = fVar8 * (float)local_1788._0_4_;
          auVar75._4_4_ = fVar9 * (float)local_1788._4_4_;
          auVar75._8_4_ = fVar10 * fStack_1780;
          auVar75._12_4_ = fVar11 * fStack_177c;
          local_1728 = vminps_avx512vl(auVar75,auVar46);
          local_1708 = vpbroadcastd_avx512vl();
          local_1718 = vpbroadcastd_avx512vl();
          local_1768 = local_17b8._0_8_;
          uStack_1760 = local_17b8._8_8_;
          local_1758 = local_17c8._0_8_;
          uStack_1750 = local_17c8._8_8_;
          local_1748 = local_17d8;
          vpcmpeqd_avx2(ZEXT1632(local_1738),ZEXT1632(local_1738));
          uStack_16f4 = context->user->instID[0];
          local_16f8 = uStack_16f4;
          uStack_16f0 = uStack_16f4;
          uStack_16ec = uStack_16f4;
          uStack_16e8 = context->user->instPrimID[0];
          uStack_16e4 = uStack_16e8;
          uStack_16e0 = uStack_16e8;
          uStack_16dc = uStack_16e8;
          local_18f8 = *(undefined1 (*) [16])(ray + 0x80);
          auVar46 = vblendmps_avx512vl(local_18f8,local_17a8);
          bVar42 = (bool)(bVar33 >> 1 & 1);
          bVar6 = (bool)(bVar33 >> 2 & 1);
          *(uint *)(ray + 0x80) =
               (uint)(bVar33 & 1) * auVar46._0_4_ | !(bool)(bVar33 & 1) * uStack_16e8;
          *(uint *)(ray + 0x84) = (uint)bVar42 * auVar46._4_4_ | !bVar42 * uStack_16e8;
          *(uint *)(ray + 0x88) = (uint)bVar6 * auVar46._8_4_ | !bVar6 * uStack_16e8;
          *(uint *)(ray + 0x8c) =
               (uint)(bVar33 >> 3) * auVar46._12_4_ | !(bool)(bVar33 >> 3) * uStack_16e8;
          local_1918 = vpmovm2d_avx512vl((ulong)bVar33);
          args.valid = (int *)local_1918;
          args.geometryUserPtr = pGVar4->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1768;
          args.N = 4;
          args.ray = (RTCRayN *)ray;
          if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar4->occlusionFilterN)(&args);
            auVar92 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
            auVar99 = ZEXT1664(auVar46);
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar98 = ZEXT1664(auVar46);
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar97 = ZEXT1664(auVar46);
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar96 = ZEXT1664(auVar46);
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
            auVar95 = ZEXT1664(auVar46);
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar94 = ZEXT1664(auVar46);
          }
          uVar43 = vptestmd_avx512vl(local_1918,local_1918);
          uVar43 = uVar43 & 0xf;
          if ((char)uVar43 != '\0') {
            p_Var5 = context->args->filter;
            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var5)(&args);
              auVar92 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
              auVar99 = ZEXT1664(auVar46);
              auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar98 = ZEXT1664(auVar46);
              auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar97 = ZEXT1664(auVar46);
              auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar96 = ZEXT1664(auVar46);
              auVar46 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
              auVar95 = ZEXT1664(auVar46);
              auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar94 = ZEXT1664(auVar46);
            }
            uVar43 = vptestmd_avx512vl(local_1918,local_1918);
            uVar43 = uVar43 & 0xf;
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar42 = (bool)((byte)uVar43 & 1);
            auVar71._0_4_ = (uint)bVar42 * auVar46._0_4_ | (uint)!bVar42 * *(int *)(args.ray + 0x80)
            ;
            bVar42 = (bool)((byte)(uVar43 >> 1) & 1);
            auVar71._4_4_ = (uint)bVar42 * auVar46._4_4_ | (uint)!bVar42 * *(int *)(args.ray + 0x84)
            ;
            bVar42 = (bool)((byte)(uVar43 >> 2) & 1);
            auVar71._8_4_ = (uint)bVar42 * auVar46._8_4_ | (uint)!bVar42 * *(int *)(args.ray + 0x88)
            ;
            bVar42 = SUB81(uVar43 >> 3,0);
            auVar71._12_4_ =
                 (uint)bVar42 * auVar46._12_4_ | (uint)!bVar42 * *(int *)(args.ray + 0x8c);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar71;
          }
          bVar42 = (bool)((byte)uVar43 & 1);
          auVar72._0_4_ = (uint)bVar42 * *(int *)pRVar1 | (uint)!bVar42 * local_18f8._0_4_;
          bVar42 = (bool)((byte)(uVar43 >> 1) & 1);
          auVar72._4_4_ = (uint)bVar42 * *(int *)(ray + 0x84) | (uint)!bVar42 * local_18f8._4_4_;
          bVar42 = (bool)((byte)(uVar43 >> 2) & 1);
          auVar72._8_4_ = (uint)bVar42 * *(int *)(ray + 0x88) | (uint)!bVar42 * local_18f8._8_4_;
          bVar42 = SUB81(uVar43 >> 3,0);
          auVar72._12_4_ = (uint)bVar42 * *(int *)(ray + 0x8c) | (uint)!bVar42 * local_18f8._12_4_;
          *(undefined1 (*) [16])pRVar1 = auVar72;
        }
        bVar34 = ((byte)uVar43 ^ 0xf) & bVar34;
      }
      if ((bVar34 == 0) || (bVar42 = 2 < uVar32, uVar32 = uVar32 + 1, bVar42)) break;
    }
    bVar30 = bVar30 & bVar34;
    if (bVar30 == 0) break;
  }
  bVar30 = bVar30 ^ 0xf;
LAB_00738e2e:
  bVar37 = bVar37 | bVar30;
  if (bVar37 == 0xf) {
LAB_00738e37:
    iVar31 = 3;
  }
  else {
    auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    tray.tfar.field_0.i[0] =
         (uint)(bVar37 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar37 & 1) * tray.tfar.field_0.i[0];
    bVar42 = (bool)(bVar37 >> 1 & 1);
    tray.tfar.field_0.i[1] = (uint)bVar42 * auVar46._4_4_ | (uint)!bVar42 * tray.tfar.field_0.i[1];
    bVar42 = (bool)(bVar37 >> 2 & 1);
    tray.tfar.field_0.i[2] = (uint)bVar42 * auVar46._8_4_ | (uint)!bVar42 * tray.tfar.field_0.i[2];
    bVar42 = (bool)(bVar37 >> 3 & 1);
    tray.tfar.field_0.i[3] = (uint)bVar42 * auVar46._12_4_ | (uint)!bVar42 * tray.tfar.field_0.i[3];
    iVar31 = 0;
  }
LAB_00738e5f:
  if (iVar31 == 3) {
    bVar37 = bVar37 & bVar44;
    bVar42 = (bool)(bVar37 >> 1 & 1);
    bVar6 = (bool)(bVar37 >> 2 & 1);
    *(uint *)pRVar1 =
         (uint)(bVar37 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar37 & 1) * *(int *)pRVar1;
    *(uint *)(ray + 0x84) = (uint)bVar42 * auVar97._4_4_ | (uint)!bVar42 * *(int *)(ray + 0x84);
    *(uint *)(ray + 0x88) = (uint)bVar6 * auVar97._8_4_ | (uint)!bVar6 * *(int *)(ray + 0x88);
    *(uint *)(ray + 0x8c) =
         (uint)(bVar37 >> 3) * auVar97._12_4_ | (uint)!(bool)(bVar37 >> 3) * *(int *)(ray + 0x8c);
    return;
  }
  goto LAB_0073842c;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }